

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# info.h
# Opt level: O3

void __thiscall bandit::reporter::info::it_succeeded(info *this,string *desc)

{
  int *piVar1;
  _Elt_pointer pcVar2;
  ostream *poVar3;
  long *local_88;
  long local_80;
  long local_78 [2];
  long *local_68;
  long local_60;
  long local_58 [2];
  long *local_48;
  long local_40;
  long local_38 [2];
  
  piVar1 = &(this->super_colored_base).super_progress_base.specs_succeeded_;
  *piVar1 = *piVar1 + 1;
  pcVar2 = (this->context_stack_).c.
           super__Deque_base<bandit::reporter::info::context_info,_std::allocator<bandit::reporter::info::context_info>_>
           ._M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (pcVar2 == (this->context_stack_).c.
                super__Deque_base<bandit::reporter::info::context_info,_std::allocator<bandit::reporter::info::context_info>_>
                ._M_impl.super__Deque_impl_data._M_finish._M_first) {
    pcVar2 = (this->context_stack_).c.
             super__Deque_base<bandit::reporter::info::context_info,_std::allocator<bandit::reporter::info::context_info>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 10;
  }
  pcVar2[-1].total = pcVar2[-1].total + 1;
  this->indentation_ = this->indentation_ + -1;
  poVar3 = (this->super_colored_base).stm_;
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\r",1);
  local_48 = local_38;
  std::__cxx11::string::_M_construct((ulong)&local_48,(char)this->indentation_ * '\x02');
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>(poVar3,(char *)local_48,local_40);
  (*((this->super_colored_base).colorizer_)->_vptr_interface[2])(&local_68);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>(poVar3,(char *)local_68,local_60);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"[ PASS ]",8);
  (*((this->super_colored_base).colorizer_)->_vptr_interface[7])(&local_88);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>(poVar3,(char *)local_88,local_80);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3," it ",4);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar3,(desc->_M_dataplus)._M_p,desc->_M_string_length);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  std::ostream::flush();
  if (local_88 != local_78) {
    operator_delete(local_88,local_78[0] + 1);
  }
  if (local_68 != local_58) {
    operator_delete(local_68,local_58[0] + 1);
  }
  if (local_48 != local_38) {
    operator_delete(local_48,local_38[0] + 1);
  }
  std::ostream::flush();
  return;
}

Assistant:

void it_succeeded(const std::string& desc) override {
        progress_base::it_succeeded(desc);
        ++context_stack_.top().total;
        --indentation_;
        stm_
            << "\r" << indent()
            << colorizer_.good()
            << "[ PASS ]"
            << colorizer_.reset()
            << " it " << desc
            << std::endl;
        stm_.flush();
      }